

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_unknownUnitsScalingFactorCompatible_Test::~Units_unknownUnitsScalingFactorCompatible_Test
          (Units_unknownUnitsScalingFactorCompatible_Test *this)

{
  Units_unknownUnitsScalingFactorCompatible_Test *this_local;
  
  ~Units_unknownUnitsScalingFactorCompatible_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, unknownUnitsScalingFactorCompatible)
{
    auto model = libcellml::Model::create("model1");
    auto u1 = libcellml::Units::create("units");
    u1->addUnit("banana");

    model->addUnits(u1);

    auto scaling = libcellml::Units::scalingFactor(u1, u1, true);
    EXPECT_EQ(0.0, scaling);
}